

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O0

int Set2ActuatorsRoboteq(ROBOTEQ *pRoboteq,double u_1,double u_2)

{
  int iVar1;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int pws [3];
  int selectedchannels [3];
  double u_2_local;
  double u_1_local;
  ROBOTEQ *pRoboteq_local;
  
  memset(pws + 1,0,0xc);
  memset(&local_38,0,0xc);
  local_40 = (int)((u_1 * 1000.0) / 2.0) + 0x5dc;
  local_4c = (int)((u_2 * 1000.0) / 2.0) + 0x5dc;
  local_3c = local_40;
  if (1999 < local_40) {
    local_3c = 2000;
  }
  if (local_3c < 0x3e9) {
    local_44 = 1000;
  }
  else {
    if (1999 < local_40) {
      local_40 = 2000;
    }
    local_44 = local_40;
  }
  local_38 = local_44;
  local_48 = local_4c;
  if (1999 < local_4c) {
    local_48 = 2000;
  }
  if (local_48 < 0x3e9) {
    local_50 = 1000;
  }
  else {
    if (1999 < local_4c) {
      local_4c = 2000;
    }
    local_50 = local_4c;
  }
  local_34 = local_50;
  pws[1] = 1;
  pws[2] = 1;
  iVar1 = SetAllPWMsRoboteq(pRoboteq,pws + 1,&local_38);
  return iVar1;
}

Assistant:

inline int Set2ActuatorsRoboteq(ROBOTEQ* pRoboteq, double u_1, double u_2)
{
	int selectedchannels[NB_CHANNELS_PWM_ROBOTEQ];
	int pws[NB_CHANNELS_PWM_ROBOTEQ];

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert u (in [-1;1]) into Roboteq pulse width (in us).
	pws[0] = DEFAULT_MID_PW_ROBOTEQ+(int)(u_1*(DEFAULT_MAX_PW_ROBOTEQ-DEFAULT_MIN_PW_ROBOTEQ)/2.0);
	pws[1] = DEFAULT_MID_PW_ROBOTEQ+(int)(u_2*(DEFAULT_MAX_PW_ROBOTEQ-DEFAULT_MIN_PW_ROBOTEQ)/2.0);

	pws[0] = max(min(pws[0], DEFAULT_MAX_PW_ROBOTEQ), DEFAULT_MIN_PW_ROBOTEQ);
	pws[1] = max(min(pws[1], DEFAULT_MAX_PW_ROBOTEQ), DEFAULT_MIN_PW_ROBOTEQ);

	selectedchannels[0] = 1;
	selectedchannels[1] = 1;

	return SetAllPWMsRoboteq(pRoboteq, selectedchannels, pws);
}